

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O0

void Iex_3_2::setFpExceptions(int when)

{
  int mask;
  int *in_stack_00000008;
  int in_stack_00000014;
  
  FpuControl::setExceptionMask(in_stack_00000014,in_stack_00000008);
  FpuControl::clearExceptions();
  return;
}

Assistant:

void
setFpExceptions (int when)
{
    int mask = FpuControl::ALL_EXC;

    if (when & IEEE_OVERFLOW) mask &= ~FpuControl::OVERFLOW_EXC;
    if (when & IEEE_UNDERFLOW) mask &= ~FpuControl::UNDERFLOW_EXC;
    if (when & IEEE_DIVZERO) mask &= ~FpuControl::DIVZERO_EXC;
    if (when & IEEE_INEXACT) mask &= ~FpuControl::INEXACT_EXC;
    if (when & IEEE_INVALID) mask &= ~FpuControl::INVALID_EXC;

    //
    // The Linux kernel apparently sometimes passes
    // incorrect si_info to signal handlers unless
    // the exception flags are cleared.
    //
    // XXX is this still true on 2.4+ kernels?
    //

    FpuControl::setExceptionMask (mask);
    FpuControl::clearExceptions ();
}